

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

sha1_hash * __thiscall
libtorrent::session_handle::dht_put_item
          (sha1_hash *__return_storage_ptr__,session_handle *this,entry *data)

{
  span<const_char> local_60;
  hasher local_50 [3];
  vector<char,_std::allocator<char>_> *local_38;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> buf;
  entry *data_local;
  session_handle *this_local;
  
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = data;
  ::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_30);
  local_38 = (vector<char,_std::allocator<char>_> *)
             ::std::back_inserter<std::vector<char,std::allocator<char>>>
                       ((vector<char,_std::allocator<char>_> *)local_30);
  bencode<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
            ((back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)local_38,data);
  span<char_const>::span<std::vector<char,std::allocator<char>>,char,void>
            ((span<char_const> *)&local_60,(vector<char,_std::allocator<char>_> *)local_30);
  lcrypto::hasher::hasher(local_50,local_60);
  lcrypto::hasher::final(__return_storage_ptr__,local_50);
  lcrypto::hasher::~hasher(local_50);
  async_call<void(libtorrent::aux::session_impl::*)(libtorrent::entry_const&,libtorrent::digest32<160l>),libtorrent::entry&,libtorrent::digest32<160l>const&>
            (this,0x59d690,(entry *)0x0,(digest32<160L> *)data);
  ::std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

sha1_hash session_handle::dht_put_item(entry data)
	{
		std::vector<char> buf;
		bencode(std::back_inserter(buf), data);
		sha1_hash const ret = hasher(buf).final();

#ifndef TORRENT_DISABLE_DHT
		async_call(&session_impl::dht_put_immutable_item, data, ret);
#endif
		return ret;
	}